

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_check_circmod_add(lys_module *module)

{
  ly_ctx *plVar1;
  byte bVar2;
  int iVar3;
  lys_module **pplVar4;
  
  plVar1 = module->ctx;
  bVar2 = (plVar1->models).parsing_sub_modules_count + 1;
  (plVar1->models).parsing_sub_modules_count = bVar2;
  pplVar4 = (lys_module **)ly_realloc((plVar1->models).parsing_sub_modules,(ulong)bVar2 << 3);
  (plVar1->models).parsing_sub_modules = pplVar4;
  if (pplVar4 == (lys_module **)0x0) {
    ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_check_circmod_add");
    iVar3 = -1;
  }
  else {
    pplVar4[(ulong)(plVar1->models).parsing_sub_modules_count - 1] = module;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
lyp_check_circmod_add(struct lys_module *module)
{
    struct ly_modules_list *models = &module->ctx->models;

    /* storing - enlarge the list of modules being currently parsed */
    ++models->parsing_sub_modules_count;
    models->parsing_sub_modules = ly_realloc(models->parsing_sub_modules,
                                             models->parsing_sub_modules_count * sizeof *models->parsing_sub_modules);
    LY_CHECK_ERR_RETURN(!models->parsing_sub_modules, LOGMEM(module->ctx), -1);
    models->parsing_sub_modules[models->parsing_sub_modules_count - 1] = module;

    return 0;
}